

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O2

char * GetFileNameWithoutExt(char *filePath)

{
  int i;
  char *__src;
  ulong uVar1;
  ulong uVar2;
  
  memset(GetFileNameWithoutExt::fileName,0,0x100);
  if (filePath != (char *)0x0) {
    __src = GetFileName(filePath);
    strcpy(GetFileNameWithoutExt::fileName,__src);
    uVar1 = strlen(GetFileNameWithoutExt::fileName);
    do {
      if ((int)uVar1 < 1) {
        return GetFileNameWithoutExt::fileName;
      }
      uVar2 = uVar1 & 0xffffffff;
      uVar1 = (ulong)((int)uVar1 - 1);
    } while (GetFileNameWithoutExt::fileName[uVar2] != '.');
    GetFileNameWithoutExt::fileName[uVar2] = '\0';
  }
  return GetFileNameWithoutExt::fileName;
}

Assistant:

const char *GetFileNameWithoutExt(const char *filePath)
{
    #define MAX_FILENAME_LENGTH     256

    static char fileName[MAX_FILENAME_LENGTH] = { 0 };
    memset(fileName, 0, MAX_FILENAME_LENGTH);

    if (filePath != NULL)
    {
        strcpy(fileName, GetFileName(filePath)); // Get filename.ext without path
        int size = (int)strlen(fileName); // Get size in bytes

        for (int i = size; i > 0; i--) // Reverse search '.'
        {
            if (fileName[i] == '.')
            {
                // NOTE: We break on first '.' found
                fileName[i] = '\0';
                break;
            }
        }
    }

    return fileName;
}